

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviz.cpp
# Opt level: O0

Style * __thiscall
ccs::Dumper::nodeStyle_abi_cxx11_(Style *__return_storage_ptr__,Dumper *this,Node *node)

{
  bool bVar1;
  mapped_type *pmVar2;
  pointer ppVar3;
  string *psVar4;
  Key *pKVar5;
  ostream *poVar6;
  allocator local_2a9;
  key_type local_2a8;
  allocator local_281;
  key_type local_280;
  string local_260 [32];
  _Self local_240;
  _Self local_238;
  const_iterator it;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::Property>_>_>
  *props;
  ostringstream str;
  allocator local_a9;
  key_type local_a8;
  allocator local_81;
  key_type local_80;
  allocator local_49;
  key_type local_48;
  byte local_21;
  Node *local_20;
  Node *node_local;
  Dumper *this_local;
  Style *style;
  
  local_21 = 0;
  local_20 = node;
  node_local = (Node *)this;
  this_local = (Dumper *)__return_storage_ptr__;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"shape",&local_49);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](__return_storage_ptr__,&local_48);
  std::__cxx11::string::operator=((string *)pmVar2,"box");
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"style",&local_81);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](__return_storage_ptr__,&local_80);
  std::__cxx11::string::operator=((string *)pmVar2,"rounded");
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"nodesep",&local_a9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](__return_storage_ptr__,&local_a8);
  std::__cxx11::string::operator=((string *)pmVar2,"2.0");
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&props);
  it._M_node = (_Base_ptr)Node::properties_abi_cxx11_(local_20);
  local_238._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::Property>_>_>
       ::cbegin((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::Property>_>_>
                 *)it._M_node);
  while( true ) {
    local_240._M_node =
         (_Base_ptr)
         std::
         multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::Property>_>_>
         ::cend(it._M_node);
    bVar1 = std::operator!=(&local_238,&local_240);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::Property>_>
             ::operator->(&local_238);
    bVar1 = Property::override(&ppVar3->second);
    if (bVar1) {
      std::operator<<((ostream *)&props,"@override ");
    }
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::Property>_>
             ::operator->(&local_238);
    poVar6 = std::operator<<((ostream *)&props,(string *)ppVar3);
    poVar6 = std::operator<<(poVar6," = ");
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::Property>_>
             ::operator->(&local_238);
    psVar4 = Property::strValue_abi_cxx11_(&ppVar3->second);
    poVar6 = std::operator<<(poVar6,(string *)psVar4);
    std::operator<<(poVar6,"\n");
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::Property>_>
    ::operator++(&local_238);
  }
  pKVar5 = Node::allConstraints(local_20);
  bVar1 = Key::empty(pKVar5);
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&props,"@constrain ");
    pKVar5 = Node::allConstraints(local_20);
    ccs::operator<<(poVar6,pKVar5);
  }
  std::__cxx11::ostringstream::str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_280,"label",&local_281);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](__return_storage_ptr__,&local_280);
  std::__cxx11::string::operator=((string *)pmVar2,local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a8,"fontsize",&local_2a9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](__return_storage_ptr__,&local_2a8);
  std::__cxx11::string::operator=((string *)pmVar2,"9");
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  local_21 = 1;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&props);
  if ((local_21 & 1) == 0) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Style Dumper::nodeStyle(const Node &node) const {
  Style style;
  style["shape"] = "box";
  style["style"] = "rounded";
  style["nodesep"] = "2.0";

  std::ostringstream str;
  const auto &props = node.properties();
  for (auto it = props.cbegin(); it != props.cend(); ++it) {
    if (it->second.override()) str << "@override ";
    str << it->first << " = " << it->second.strValue() << "\n";
  }
  if (!node.allConstraints().empty())
    str << "@constrain " << node.allConstraints();
  style["label"] = str.str();
  style["fontsize"] = "9";
  return style;
}